

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

JitPolyEquivalentTypeGuard * __thiscall
Func::CreatePolyEquivalentTypeGuard(Func *this,uint32 objTypeSpecFldId)

{
  int index;
  Allocator *pAVar1;
  JitPolyEquivalentTypeGuard *this_00;
  TrackAllocData local_48;
  JitPolyEquivalentTypeGuard *local_20;
  JitPolyEquivalentTypeGuard *guard;
  Func *pFStack_10;
  uint32 objTypeSpecFldId_local;
  Func *this_local;
  
  guard._4_4_ = objTypeSpecFldId;
  pFStack_10 = this;
  EnsureEquivalentTypeGuards(this);
  pAVar1 = GetNativeCodeDataAllocator(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&Js::JitPolyEquivalentTypeGuard::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
             ,0x657);
  pAVar1 = NativeCodeData::Allocator::TrackAllocInfo(pAVar1,&local_48);
  this_00 = (JitPolyEquivalentTypeGuard *)
            new<NativeCodeData::AllocatorNoFixup<Js::JitPolyEquivalentTypeGuard>>
                      (0x60,(AllocatorNoFixup<Js::JitPolyEquivalentTypeGuard> *)pAVar1,0x55a600);
  index = this->indexedPropertyGuardCount;
  this->indexedPropertyGuardCount = index + 1;
  Js::JitPolyEquivalentTypeGuard::JitPolyEquivalentTypeGuard(this_00,index,guard._4_4_);
  local_20 = this_00;
  InitializeEquivalentTypeGuard(this,(JitEquivalentTypeGuard *)this_00);
  return local_20;
}

Assistant:

Js::JitPolyEquivalentTypeGuard*
Func::CreatePolyEquivalentTypeGuard(uint32 objTypeSpecFldId)
{
    EnsureEquivalentTypeGuards();

    Js::JitPolyEquivalentTypeGuard* guard = NativeCodeDataNewNoFixup(GetNativeCodeDataAllocator(), Js::JitPolyEquivalentTypeGuard, this->indexedPropertyGuardCount++, objTypeSpecFldId);

    this->InitializeEquivalentTypeGuard(guard);

    return guard;
}